

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O3

void Msat_SolverRemoveMarked(Msat_Solver_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Msat_Clause_t **ppMVar4;
  long lVar5;
  ulong uVar6;
  
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  ppMVar4 = Msat_ClauseVecReadArray(p->vClauses);
  iVar3 = p->nClausesStart;
  if (iVar3 < iVar1) {
    lVar5 = 0;
    do {
      Msat_ClauseFree(p,ppMVar4[iVar3 + lVar5],1);
      lVar5 = lVar5 + 1;
    } while (iVar1 - iVar3 != (int)lVar5);
    iVar3 = p->nClausesStart;
  }
  Msat_ClauseVecShrink(p->vClauses,iVar3);
  uVar2 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar4 = Msat_ClauseVecReadArray(p->vLearned);
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      Msat_ClauseFree(p,ppMVar4[uVar6],1);
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  Msat_ClauseVecShrink(p->vLearned,0);
  iVar3 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClauses = iVar3;
  return;
}

Assistant:

void Msat_SolverRemoveMarked( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned, ** pClauses;
    int nLearned, nClauses, i;

    // discard the learned clauses
    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = p->nClausesStart; i < nClauses; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pClauses[i]) );
        Msat_ClauseFree( p, pClauses[i], 1 );
    }
    Msat_ClauseVecShrink( p->vClauses, p->nClausesStart );

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);
/*
    // undo the previous data
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pAssigns[i]   = MSAT_VAR_UNASSIGNED;
        p->pReasons[i]   = NULL;
        p->pLevel[i]     = -1;
        p->pdActivity[i] = 0.0;
    }
    Msat_OrderClean( p->pOrder, p->nVars, NULL );
    Msat_QueueClear( p->pQueue );
*/
}